

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerWithAttr::IsWritable
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  uint uVar4;
  undefined4 *puVar5;
  ObjectSlotAttributes *pOVar6;
  
  PVar3 = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  if (PVar3 == 0xffff) {
    uVar4 = 1;
  }
  else {
    pOVar6 = (this->attributes).ptr;
    if (pOVar6 == (ObjectSlotAttributes *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe06,"(attributes)","attributes");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pOVar6 = (this->attributes).ptr;
    }
    uVar4 = pOVar6[PVar3] & 4;
  }
  return uVar4;
}

Assistant:

BOOL PathTypeHandlerWithAttr::IsWritable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex != Constants::NoSlot)
        {
            Assert(attributes);
            return (attributes[propertyIndex] & ObjectSlotAttr_Writable);
        }
        return true;
    }